

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.hxx
# Opt level: O0

Geometry<std::allocator<unsigned_long>_> * __thiscall
andres::marray_detail::Geometry<std::allocator<unsigned_long>_>::operator=
          (Geometry<std::allocator<unsigned_long>_> *this,
          Geometry<std::allocator<unsigned_long>_> *g)

{
  unsigned_long *puVar1;
  Geometry<std::allocator<unsigned_long>_> *g_local;
  Geometry<std::allocator<unsigned_long>_> *this_local;
  
  if (g != this) {
    if (g->dimension_ != this->dimension_) {
      __gnu_cxx::new_allocator<unsigned_long>::deallocate
                ((new_allocator<unsigned_long> *)this,this->shape_,this->dimension_ * 3);
      this->dimension_ = g->dimension_;
      puVar1 = __gnu_cxx::new_allocator<unsigned_long>::allocate
                         ((new_allocator<unsigned_long> *)this,this->dimension_ * 3,(void *)0x0);
      this->shape_ = puVar1;
      this->shapeStrides_ = this->shape_ + this->dimension_;
      this->strides_ = this->shapeStrides_ + this->dimension_;
      this->dimension_ = g->dimension_;
    }
    memcpy(this->shape_,g->shape_,this->dimension_ * 0x18);
    this->size_ = g->size_;
    this->coordinateOrder_ = g->coordinateOrder_;
    this->isSimple_ = (bool)(g->isSimple_ & 1);
  }
  return this;
}

Assistant:

inline Geometry<A>& 
Geometry<A>::operator=
(
    const Geometry<A>& g
)
{
    if(&g != this) { // no self-assignment
        if(g.dimension_ != dimension_) {
            allocator_.deallocate(shape_, dimension_*3);
            dimension_ = g.dimension_;
            shape_ = allocator_.allocate(dimension_*3);
            shapeStrides_ = shape_+dimension_;
            strides_ = shapeStrides_+dimension_;
            dimension_ = g.dimension_;
        }
        /*
        for(std::size_t j=0; j<dimension_; ++j) {
            shape_[j] = g.shape_[j];
            shapeStrides_[j] = g.shapeStrides_[j];
            strides_[j] = g.strides_[j];
        }
        */
        memcpy(shape_, g.shape_, (dimension_*3)*sizeof(std::size_t));
        size_ = g.size_;
        coordinateOrder_ = g.coordinateOrder_;
        isSimple_ = g.isSimple_;
    }
    return *this;
}